

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

qsbr_value_view __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::get_val(iterator *this)

{
  ulong uVar1;
  long lVar2;
  size_t extraout_RDX;
  long in_RSI;
  qsbr_value_view qVar3;
  span<const_std::byte,_18446744073709551615UL> local_20;
  
  lVar2 = *(long *)(in_RSI + 0x38);
  if (lVar2 == *(long *)(in_RSI + 0x18)) {
    __assert_fail("valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0xa65,
                  "qsbr_value_view unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::iterator::get_val() const [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                 );
  }
  if (lVar2 == *(long *)(in_RSI + 0x40)) {
    lVar2 = *(long *)(*(long *)(in_RSI + 0x50) + -8) + 0x200;
  }
  uVar1 = *(ulong *)(lVar2 + -0x20);
  if ((uVar1 & 7) == 0) {
    local_20._M_extent._M_extent_value = (size_t)*(uint *)(uVar1 + 0x1c);
    local_20._M_ptr = (pointer)(uVar1 + *(uint *)(uVar1 + 0x18) + 0x20);
    qsbr_ptr_span<const_std::byte>::qsbr_ptr_span((qsbr_ptr_span<const_std::byte> *)this,&local_20);
    qVar3.length = extraout_RDX;
    qVar3.start.ptr = (pointer)this;
    return qVar3;
  }
  __assert_fail("node.type() == node_type::LEAF",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0xa68,
                "qsbr_value_view unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::iterator::get_val() const [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
               );
}

Assistant:

qsbr_value_view olc_db<Key, Value>::iterator::get_val() const noexcept {
  // Note: If the iterator is on a leaf, we return the value for
  // that leaf regardless of whether the leaf has been deleted.
  // This is part of the design semantics for the OLC ART scan.
  UNODB_DETAIL_ASSERT(valid());  // by contract
  const auto& e = stack_.top();
  const auto& node = e.node;
  UNODB_DETAIL_ASSERT(node.type() == node_type::LEAF);      // On a leaf.
  const auto* const leaf{node.template ptr<leaf_type*>()};  // current leaf.
  return qsbr_ptr_span{leaf->get_value_view()};
}